

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_shrink_to_fit(run_container_t *src)

{
  rle16_t *__ptr;
  rle16_t *prVar1;
  rle16_t *oldruns;
  int savings;
  run_container_t *src_local;
  
  if (src->n_runs == src->capacity) {
    src_local._4_4_ = 0;
  }
  else {
    src_local._4_4_ = src->capacity - src->n_runs;
    src->capacity = src->n_runs;
    __ptr = src->runs;
    prVar1 = (rle16_t *)realloc(__ptr,(long)src->capacity << 2);
    src->runs = prVar1;
    if (src->runs == (rle16_t *)0x0) {
      free(__ptr);
    }
  }
  return src_local._4_4_;
}

Assistant:

int run_container_shrink_to_fit(run_container_t *src) {
    if (src->n_runs == src->capacity) return 0;  // nothing to do
    int savings = src->capacity - src->n_runs;
    src->capacity = src->n_runs;
    rle16_t *oldruns = src->runs;
    src->runs = (rle16_t *)realloc(oldruns, src->capacity * sizeof(rle16_t));
    if (src->runs == NULL) free(oldruns);  // should never happen?
    return savings;
}